

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_lc.c
# Opt level: O2

double * MatSub(double *A,double *B,int row,int col)

{
  double *pdVar1;
  ulong uVar2;
  ulong uVar3;
  double *pdVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  
  lVar6 = (long)col;
  pdVar1 = (double *)malloc(row * lVar6 * 8);
  uVar2 = 0;
  uVar3 = 0;
  if (0 < col) {
    uVar3 = (ulong)(uint)col;
  }
  pdVar4 = pdVar1;
  uVar7 = (ulong)(uint)row;
  if (row < 1) {
    uVar7 = uVar2;
  }
  for (; uVar2 != uVar7; uVar2 = uVar2 + 1) {
    for (uVar5 = 0; uVar3 != uVar5; uVar5 = uVar5 + 1) {
      pdVar4[uVar5] = A[uVar5] - B[uVar5];
    }
    A = A + lVar6;
    B = B + lVar6;
    pdVar4 = pdVar4 + lVar6;
  }
  return pdVar1;
}

Assistant:

double *MatSub(double *A, double *B, int row, int col) {
    double *Out = (double *) malloc(sizeof(double) * row * col);
    for (int i = 0; i < row; i++)
        for (int j = 0; j < col; j++)
            Out[col * i + j] = A[col * i + j] - B[col * i + j];
    return Out;
}